

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  long *plVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char *v;
  buffer buf;
  long *local_90;
  undefined8 *local_88 [2];
  undefined1 local_78 [72];
  
  mtrace();
  mpt::array::array((array *)&local_90,0);
  mpt::io::buffer::buffer((buffer *)local_88,(array *)&local_90);
  if (local_90 != (long *)0x0) {
    (**(code **)(*local_90 + 8))();
  }
  if (0 < argc) {
    uVar4 = 0;
    do {
      __s = argv[uVar4];
      strlen(__s);
      mpt::io::buffer::write((ulong)local_88,(void *)0x1,(ulong)__s);
      uVar4 = uVar4 + 1;
    } while ((uint)argc != uVar4);
  }
  local_90 = (long *)strrchr(*argv,0x2f);
  if (local_90 != (long *)0x0) {
    mpt::encode_array::shift((ulong)local_78);
  }
  do {
    uVar4 = (*(code *)*local_88[0])();
    if (uVar4 == 0) break;
    iVar2 = mpt::value::convert(uVar4,(void *)0x73);
    plVar1 = local_90;
    if (iVar2 < 0) break;
    if (local_90 == (long *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105078);
    }
    else {
      sVar3 = strlen((char *)local_90);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar1,sVar3)
      ;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    iVar2 = mpt::io::buffer::advance();
  } while (0 < iVar2);
  mpt::io::buffer::~buffer((buffer *)local_88);
  return 0;
}

Assistant:

extern int main(int argc, char * const argv[])
{
	mtrace();
	
	mpt::io::buffer buf;
	
	// write arguments (null-terminated) to buffer
	for (int i = 0; i < argc; ++i) {
		buf.write(1, argv[i], strlen(argv[i]) + 1);
	}
	// consume first argument up to path separator
	const char *v;
	if ((v = std::strrchr(*argv, '/'))) {
		buf.shift(v + 1 - *argv);
	}
	// print arguments in buffer
	while (buf.iterator::get(v)) {
		std::cout << v << std::endl;
		if (buf.advance() <= 0) {
			break;
		}
	}
	return 0;
}